

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  secp256k1_context *psVar1;
  
  if (prealloc != (void *)0x0) {
    psVar1 = (secp256k1_context *)memcpy(prealloc,ctx,0xd0);
    return psVar1;
  }
  (*(ctx->illegal_callback).fn)("prealloc != NULL",(ctx->illegal_callback).data);
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);

    ret = (secp256k1_context*)prealloc;
    *ret = *ctx;
    return ret;
}